

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpphttplibconnector.hpp
# Opt level: O3

void __thiscall
CppHttpLibServerConnector::CppHttpLibServerConnector
          (CppHttpLibServerConnector *this,JsonRpcServer *server,int port)

{
  _Rb_tree_header *p_Var1;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_88;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  local_68;
  
  this->_vptr_CppHttpLibServerConnector = (_func_int **)&PTR__CppHttpLibServerConnector_0016e630;
  (this->thread)._M_id._M_thread = 0;
  this->server = server;
  (this->httpServer)._vptr_Server = (_func_int **)&PTR__Server_0016e120;
  *(undefined8 *)&(this->httpServer).new_task_queue.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->httpServer).new_task_queue.super__Function_base._M_functor + 8) = 0;
  (this->httpServer).new_task_queue._M_invoker =
       std::
       _Function_handler<httplib::TaskQueue_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:4734:11)>
       ::_M_invoke;
  (this->httpServer).new_task_queue.super__Function_base._M_manager =
       std::
       _Function_handler<httplib::TaskQueue_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:4734:11)>
       ::_M_manager;
  (this->httpServer).svr_sock_.super___atomic_base<int>._M_i = -1;
  (this->httpServer).keep_alive_max_count_ = 5;
  (this->httpServer).keep_alive_timeout_sec_ = 5;
  (this->httpServer).read_timeout_sec_ = 5;
  (this->httpServer).read_timeout_usec_ = 0;
  (this->httpServer).write_timeout_sec_ = 5;
  (this->httpServer).write_timeout_usec_ = 0;
  (this->httpServer).idle_interval_sec_ = 0;
  (this->httpServer).idle_interval_usec_ = 0;
  (this->httpServer).payload_max_length_ = 0xffffffffffffffff;
  p_Var1 = &(this->httpServer).file_extension_and_mimetype_map_._M_t._M_impl.super__Rb_tree_header;
  (this->httpServer).file_extension_and_mimetype_map_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->httpServer).file_extension_and_mimetype_map_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  *(undefined8 *)
   ((long)&(this->httpServer).base_dirs_.
           super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->httpServer).base_dirs_.
           super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->httpServer).base_dirs_.
  super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->httpServer).base_dirs_.
  super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->httpServer).file_extension_and_mimetype_map_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->httpServer).file_extension_and_mimetype_map_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  *(undefined8 *)((long)&(this->httpServer).socket_options_.super__Function_base._M_functor + 8) = 0
  ;
  memset(&(this->httpServer).file_extension_and_mimetype_map_._M_t._M_impl.super__Rb_tree_header.
          _M_node_count,0,0x1dd);
  *(code **)&(this->httpServer).socket_options_.super__Function_base._M_functor =
       httplib::default_socket_options;
  (this->httpServer).socket_options_._M_invoker =
       std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
  (this->httpServer).socket_options_.super__Function_base._M_manager =
       std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
  p_Var1 = &(this->httpServer).default_headers_._M_t._M_impl.super__Rb_tree_header;
  (this->httpServer).default_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  (this->httpServer).default_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->httpServer).default_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->httpServer).default_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->httpServer).default_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  signal(0xd,(__sighandler_t)0x1);
  this->port = port;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/jsonrpc","");
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/examples/cpphttplibconnector.hpp:31:7)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/examples/cpphttplibconnector.hpp:31:7)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_88,&local_a8,0x10);
  std::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  ::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>,_true>
            (&local_68,&local_88,
             (function<void_(const_httplib::Request_&,_httplib::Response_&)> *)&local_c8);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
  ::
  emplace_back<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>
            ((vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
              *)&(this->httpServer).post_handlers_,&local_68);
  if (local_68.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.second.super__Function_base._M_manager)
              ((_Any_data *)&local_68.second,(_Any_data *)&local_68.second,__destroy_functor);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_68.first);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_88);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit CppHttpLibServerConnector(jsonrpccxx::JsonRpcServer &server, int port) :
    thread(),
    server(server),
    httpServer(),
    port(port) {
    httpServer.Post("/jsonrpc",
		    [this](const httplib::Request &req, httplib::Response &res) {
		      this->PostAction(req, res);
		    });
  }